

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular-array.h
# Opt level: O0

void __thiscall
wabt::CircularArray<wabt::Token,_2UL>::push_back
          (CircularArray<wabt::Token,_2UL> *this,value_type *value)

{
  size_type index;
  reference element;
  value_type *value_local;
  CircularArray<wabt::Token,_2UL> *this_local;
  
  if (this->size_ < 2) {
    index = this->size_;
    this->size_ = index + 1;
    element = at(this,index);
    CircularArray<wabt::Token,2ul>::SetElement<wabt::Token_const&>
              ((CircularArray<wabt::Token,2ul> *)this,element,value);
    return;
  }
  __assert_fail("size_ < kCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/circular-array.h"
                ,0x5d,
                "void wabt::CircularArray<wabt::Token, 2>::push_back(const value_type &) [T = wabt::Token, kCapacity = 2]"
               );
}

Assistant:

void push_back(const value_type& value) {
    assert(size_ < kCapacity);
    SetElement(at(size_++), value);
  }